

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> __thiscall
enact::Parser::parseImplStmt(Parser *this)

{
  TokenType TVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  CompileContext *pCVar5;
  CompileContext *pCVar6;
  ParseError *__return_storage_ptr__;
  CompileContext *pCVar7;
  pointer *__ptr;
  Parser *in_RSI;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> secondTypename;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> firstTypename;
  vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
  methods;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 local_70 [8];
  undefined1 local_68 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  size_t local_40 [2];
  
  local_50._M_allocated_capacity = (size_type)local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Expected typename after \'impl\'.","");
  expectTypenamePrecFunction((Parser *)(local_a8 + 8),(string *)in_RSI,SUB81(&local_50,0));
  if ((size_t *)local_50._M_allocated_capacity != local_40) {
    operator_delete((void *)local_50._M_allocated_capacity,local_40[0] + 1);
  }
  if ((in_RSI->m_current).type == FOR) {
    advance(in_RSI);
    local_50._M_allocated_capacity = (size_type)local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Expected typename after \'impl\'..\'for\'.","");
    expectTypenamePrecFunction((Parser *)local_a8,(string *)in_RSI,SUB81(&local_50,0));
    if ((size_t *)local_50._M_allocated_capacity != local_40) {
      operator_delete((void *)local_50._M_allocated_capacity,local_40[0] + 1);
    }
  }
  else {
    local_a8._0_8_ = (CompileContext *)0x0;
  }
  local_98._0_8_ = &local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,"Expected \'{\' before impl body.","");
  expect(in_RSI,LEFT_BRACE,(string *)local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ != &local_88) {
    operator_delete((void *)local_98._0_8_,local_88._0_8_ + 1);
  }
  local_68._0_8_ = (pointer)0x0;
  local_68._8_8_ = (pointer)0x0;
  local_68._16_8_ = 0;
  while ((TVar1 = (in_RSI->m_current).type, TVar1 != RIGHT_BRACE && (TVar1 != END_OF_FILE))) {
    if (TVar1 != FUNC) {
      __return_storage_ptr__ = (ParseError *)__cxa_allocate_exception(0x10);
      local_98._0_8_ = &local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,"Expected method declaration in impl body.","");
      errorAtCurrent(__return_storage_ptr__,in_RSI,(string *)local_98);
      __cxa_throw(__return_storage_ptr__,&ParseError::typeinfo,std::runtime_error::~runtime_error);
    }
    advance(in_RSI);
    parseFunctionStmt((Parser *)local_70,SUB81(in_RSI,0));
    local_98._0_8_ = local_70;
    local_70 = (undefined1  [8])0x0;
    std::
    vector<std::unique_ptr<enact::FunctionStmt,std::default_delete<enact::FunctionStmt>>,std::allocator<std::unique_ptr<enact::FunctionStmt,std::default_delete<enact::FunctionStmt>>>>
    ::emplace_back<std::unique_ptr<enact::FunctionStmt,std::default_delete<enact::FunctionStmt>>>
              ((vector<std::unique_ptr<enact::FunctionStmt,std::default_delete<enact::FunctionStmt>>,std::allocator<std::unique_ptr<enact::FunctionStmt,std::default_delete<enact::FunctionStmt>>>>
                *)local_68,
               (unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_> *)
               local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_98._0_8_ + 8))();
    }
    local_70 = (undefined1  [8])0x0;
  }
  local_98._0_8_ = &local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,"Expected \'}\' after impl body.","");
  expect(in_RSI,RIGHT_BRACE,(string *)local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ != &local_88) {
    operator_delete((void *)local_98._0_8_,local_88._0_8_ + 1);
  }
  if ((CompileContext *)local_a8._0_8_ == (CompileContext *)0x0) {
    pCVar5 = (CompileContext *)operator_new(0x30);
    pCVar6 = (CompileContext *)local_a8._8_8_;
    pCVar7 = (CompileContext *)local_a8._0_8_;
  }
  else {
    pCVar5 = (CompileContext *)operator_new(0x30);
    pCVar6 = (CompileContext *)local_a8._0_8_;
    pCVar7 = (CompileContext *)local_a8._8_8_;
  }
  uVar4 = local_68._16_8_;
  uVar3 = local_68._8_8_;
  uVar2 = local_68._0_8_;
  local_a8._8_8_ = (long *)0x0;
  local_a8._0_8_ = (CompileContext *)0x0;
  local_68._0_8_ = (pointer)0x0;
  local_68._8_8_ = (pointer)0x0;
  local_68._16_8_ = 0;
  (pCVar5->m_source)._M_dataplus._M_p = (pointer)&PTR__ImplStmt_00129158;
  (pCVar5->m_source)._M_string_length = (size_type)pCVar6;
  (pCVar5->m_source).field_2._M_allocated_capacity = (size_type)pCVar7;
  *(undefined8 *)((long)&(pCVar5->m_source).field_2 + 8) = uVar2;
  (pCVar5->m_options).m_filename._M_dataplus._M_p = (pointer)uVar3;
  (pCVar5->m_options).m_filename._M_string_length = uVar4;
  local_88._0_8_ = 0;
  local_98._0_8_ = (pointer)0x0;
  local_98._8_8_ = 0;
  std::
  vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
  ::~vector((vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
             *)local_98);
  this->m_context = pCVar5;
  std::
  vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
  ::~vector((vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
             *)local_68);
  if ((CompileContext *)local_a8._0_8_ != (CompileContext *)0x0) {
    (**(code **)((((string *)local_a8._0_8_)->_M_dataplus)._M_p + 8))();
  }
  if ((long *)local_a8._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_a8._8_8_ + 8))();
  }
  return (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
         (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::parseImplStmt() {
        std::unique_ptr<const Typename> firstTypename = expectTypename("Expected typename after 'impl'.");
        std::unique_ptr<const Typename> secondTypename = consume(TokenType::FOR)
                                                         ? expectTypename("Expected typename after 'impl'..'for'.")
                                                         : nullptr;

        expect(TokenType::LEFT_BRACE, "Expected '{' before impl body.");

        std::vector<std::unique_ptr<FunctionStmt>> methods;
        while (!check(TokenType::RIGHT_BRACE) && !isAtEnd()) {
            if (consume(TokenType::FUNC)) {
                methods.push_back(
                        static_unique_ptr_cast<FunctionStmt>(
                                parseFunctionStmt()));
            } else {
                throw errorAtCurrent("Expected method declaration in impl body.");
            }
        }

        expect(TokenType::RIGHT_BRACE, "Expected '}' after impl body.");

        if (secondTypename == nullptr) {
            // Inherent impl
            return std::make_unique<ImplStmt>(std::move(firstTypename), std::move(secondTypename), std::move(methods));
        }
        // Trait impl
        return std::make_unique<ImplStmt>(std::move(secondTypename), std::move(firstTypename), std::move(methods));
    }